

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

void interpret(Code c)

{
  Call c_00;
  clock_t cVar1;
  clock_t end;
  clock_t local_88;
  clock_t start;
  Call call;
  int local_1c;
  int i;
  Code c_local;
  
  local_1c = 0;
  globalEnv = env_new((Environment *)0x0);
  register_native(globalEnv);
  for (; local_1c < c.count; local_1c = local_1c + 1) {
    executeStatement((Object *)&call.arguments,c.parts[local_1c],globalEnv);
  }
  call.identifer._0_4_ = 0;
  call._0_8_ = strdup("Main");
  call.argCount = 0;
  call._20_4_ = 0;
  start._0_4_ = 0;
  local_88 = clock();
  c_00._4_4_ = start._4_4_;
  c_00.line = (undefined4)start;
  c_00._20_4_ = call.identifer._4_4_;
  c_00.argCount = call.identifer._0_4_;
  c_00.identifer = (char *)call._0_8_;
  c_00.arguments = (Expression **)call._16_8_;
  resolveCall((Object *)&end,c_00,globalEnv);
  cVar1 = clock();
  printf("\x1b[32m\n[Debug] [Interpreter] Execution time : %gms\x1b[0m",
         SUB84((double)(cVar1 - local_88) / 1000000.0,0));
  unload_all();
  env_free(globalEnv);
  return;
}

Assistant:

void interpret(Code c){
    int i = 0;
    globalEnv = env_new(NULL);
    register_native(globalEnv);
    while(i < c.count){
        executeStatement(c.parts[i], globalEnv);
        i++;
    }
    Call call;
    call.argCount = 0;
    call.identifer = strdup("Main");
    call.arguments = NULL;
    call.line = 0;
    clock_t start = clock();
    resolveCall(call, globalEnv);
    clock_t end = clock();
    printf(debug("[Interpreter] Execution time : %gms"), (double)(end-start)/CLOCKS_PER_SEC);
    unload_all();
    env_free(globalEnv);
}